

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ptls_buffer_t *in_RDI;
  long in_R8;
  long in_stack_00000010;
  size_t body_size_1;
  size_t body_size_3;
  size_t body_size_4;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  size_t body_start_4;
  size_t capacity_4;
  uint16_t _v;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  size_t i;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  ptls_buffer_t *in_stack_fffffffffffffec8;
  long local_b0;
  long local_98;
  long local_80;
  long local_68;
  long local_60;
  long local_50;
  long local_38;
  int local_2c;
  
  local_38 = 1;
  local_2c = ptls_buffer__do_pushv
                       (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                        in_stack_fffffffffffffeb8);
  if (local_2c == 0) {
    sVar1 = in_RDI->off;
    local_2c = ptls_buffer__do_pushv
                         (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
    if (local_2c == 0) {
      sVar2 = in_RDI->off;
      for (; local_38 != 0; local_38 = local_38 + -1) {
        in_RDI->base[sVar1 - local_38] =
             (uint8_t)(sVar2 - sVar1 >> (((char)local_38 + -1) * '\b' & 0x3fU));
      }
      local_50 = 3;
      local_2c = ptls_buffer__do_pushv
                           (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffeb8);
      if (local_2c == 0) {
        sVar1 = in_RDI->off;
        for (local_60 = 0; local_60 != in_R8; local_60 = local_60 + 1) {
          local_68 = 3;
          iVar6 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffeb8);
          if (iVar6 != 0) {
            return iVar6;
          }
          sVar2 = in_RDI->off;
          iVar6 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffeb8);
          if (iVar6 != 0) {
            return iVar6;
          }
          sVar3 = in_RDI->off;
          for (; local_68 != 0; local_68 = local_68 + -1) {
            in_RDI->base[sVar2 - local_68] =
                 (uint8_t)(sVar3 - sVar2 >> (((char)local_68 + -1) * '\b' & 0x3fU));
          }
          local_80 = 2;
          iVar6 = ptls_buffer__do_pushv
                            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffeb8);
          if (iVar6 != 0) {
            return iVar6;
          }
          sVar2 = in_RDI->off;
          if ((local_60 == 0) && (in_stack_00000010 != 0)) {
            iVar6 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
            if (iVar6 != 0) {
              return iVar6;
            }
            local_98 = 2;
            iVar6 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar3 = in_RDI->off;
            iVar6 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
            if (iVar6 != 0) {
              return iVar6;
            }
            local_b0 = 3;
            in_stack_fffffffffffffec0 = (void *)0x3;
            in_stack_fffffffffffffec8 = in_RDI;
            iVar6 = ptls_buffer__do_pushv(in_RDI,(void *)0x3,in_stack_fffffffffffffeb8);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar4 = in_RDI->off;
            iVar6 = ptls_buffer__do_pushv
                              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar5 = in_RDI->off;
            for (; local_b0 != 0; local_b0 = local_b0 + -1) {
              in_RDI->base[sVar4 - local_b0] =
                   (uint8_t)(sVar5 - sVar4 >> (((char)local_b0 + -1) * '\b' & 0x3fU));
            }
            sVar4 = in_RDI->off;
            for (; local_98 != 0; local_98 = local_98 + -1) {
              in_RDI->base[sVar3 - local_98] =
                   (uint8_t)(sVar4 - sVar3 >> (((char)local_98 + -1) * '\b' & 0x3fU));
            }
          }
          sVar3 = in_RDI->off;
          for (; local_80 != 0; local_80 = local_80 + -1) {
            in_RDI->base[sVar2 - local_80] =
                 (uint8_t)(sVar3 - sVar2 >> (((char)local_80 + -1) * '\b' & 0x3fU));
          }
        }
        sVar2 = in_RDI->off;
        for (; local_50 != 0; local_50 = local_50 + -1) {
          in_RDI->base[sVar1 - local_50] =
               (uint8_t)(sVar2 - sVar1 >> (((char)local_50 + -1) * '\b' & 0x3fU));
        }
        local_2c = 0;
      }
    }
  }
  return local_2c;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}